

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

LogicProgram * __thiscall Clasp::Asp::LogicProgram::addProject(LogicProgram *this,AtomSpan *atoms)

{
  VarVec *this_00;
  size_type sVar1;
  Aux *pAVar2;
  size_t sVar3;
  uint local_14;
  Memcpy<unsigned_int> local_10;
  
  if ((this->super_ProgramBuilder).frozen_ != true) {
    pAVar2 = this->auxData_;
    this_00 = &pAVar2->project;
    sVar3 = atoms->size;
    sVar1 = (pAVar2->project).ebo_.size;
    if (sVar3 == 0) {
      if (sVar1 == 0) {
        local_14 = 0;
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_00,&local_14);
      }
    }
    else {
      if ((sVar1 != 0) && ((this_00->ebo_).buf[sVar1 - 1] == 0)) {
        (pAVar2->project).ebo_.size = sVar1 - 1;
      }
      local_10.first_ = atoms->first;
      bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::
      insert_impl<unsigned_int,bk_lib::detail::Memcpy<unsigned_int>>
                ((pod_vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,
                 (pAVar2->project).ebo_.buf + (pAVar2->project).ebo_.size,(uint)sVar3,&local_10);
    }
    return this;
  }
  Potassco::fail(-2,"LogicProgram &Clasp::Asp::LogicProgram::addProject(const Potassco::AtomSpan &)"
                 ,0x28b,"!frozen()","Can\'t update frozen program!",0);
}

Assistant:

LogicProgram& LogicProgram::addProject(const Potassco::AtomSpan& atoms) {
	check_not_frozen();
	VarVec& pro = auxData_->project;
	if (!Potassco::empty(atoms)) {
		if (!pro.empty() && pro.back() == 0) { pro.pop_back(); }
		pro.insert(pro.end(), Potassco::begin(atoms), Potassco::end(atoms));
	}
	else if (pro.empty()) {
		pro.push_back(0);
	}
	return *this;
}